

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnamed_pipe.c
# Opt level: O0

int main(void)

{
  __pid_t _Var1;
  char *uis;
  int local_20;
  pid_t pid;
  int fds [2];
  FILE *stream;
  
  pipe(&local_20);
  _Var1 = fork();
  if (_Var1 == 0) {
    close(pid);
    uis = "r";
    fds = (int  [2])fdopen(local_20,"r");
    reader((UI *)fds,(UI_STRING *)uis);
    close(local_20);
  }
  else {
    close(local_20);
    fds = (int  [2])fdopen(pid,"w");
    writer((UI *)"Hello, world.",(UI_STRING *)0x3);
    close(pid);
  }
  return 0;
}

Assistant:

int main () 
{
    FILE * stream;
    /* Create pipe place the two ends pipe file descriptors in fds */
    int fds[2];
    pipe(fds);
    pid_t pid = fork();
    if(pid == (pid_t) 0) 
    {/* Child process (consumer) */
        close(fds[1]);         
        /* Close the copy of the fds write end */
        stream = fdopen(fds[0], "r");
        reader(stream);
        close(fds[0]);
        
    }
    else 
    {                   
        /* Parent process (producer)  */
        close(fds[0]);         
        /* Close the copy of the fds read end */
        stream = fdopen(fds[1], "w");
        writer("Hello, world.", 3, stream);
        close(fds[1]);
    }
    return 0;
    
}